

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

WhereTerm *
sqlite3WhereFindTerm(WhereClause *pWC,int iCur,int iColumn,Bitmask notReady,u32 op,Index *pIdx)

{
  WhereTerm *pWVar1;
  WhereTerm *pWVar2;
  WhereTerm *pWVar3;
  long in_FS_OFFSET;
  WhereScan scan;
  undefined1 local_98 [40];
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_98._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pWVar1 = whereScanInit((WhereScan *)local_98,pWC,iCur,iColumn,op,pIdx);
  pWVar2 = (WhereTerm *)0x0;
  while (pWVar3 = pWVar2, pWVar1 != (WhereTerm *)0x0) {
    if ((pWVar1->prereqRight & notReady) == 0) {
      if ((pWVar1->prereqRight == 0) &&
         (pWVar3 = pWVar1, (op & 0x82 & (uint)pWVar1->eOperator) != 0)) break;
      if (pWVar2 == (WhereTerm *)0x0) {
        pWVar2 = pWVar1;
      }
    }
    pWVar1 = whereScanNext((WhereScan *)local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return pWVar3;
}

Assistant:

SQLITE_PRIVATE WhereTerm *sqlite3WhereFindTerm(
  WhereClause *pWC,     /* The WHERE clause to be searched */
  int iCur,             /* Cursor number of LHS */
  int iColumn,          /* Column number of LHS */
  Bitmask notReady,     /* RHS must not overlap with this mask */
  u32 op,               /* Mask of WO_xx values describing operator */
  Index *pIdx           /* Must be compatible with this index, if not NULL */
){
  WhereTerm *pResult = 0;
  WhereTerm *p;
  WhereScan scan;

  p = whereScanInit(&scan, pWC, iCur, iColumn, op, pIdx);
  op &= WO_EQ|WO_IS;
  while( p ){
    if( (p->prereqRight & notReady)==0 ){
      if( p->prereqRight==0 && (p->eOperator&op)!=0 ){
        testcase( p->eOperator & WO_IS );
        return p;
      }
      if( pResult==0 ) pResult = p;
    }
    p = whereScanNext(&scan);
  }
  return pResult;
}